

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::AddUGroup(CharClassBuilder *cc,UGroup *g,int sign,ParseFlags parse_flags)

{
  ParseFlags PVar1;
  ParseFlags in_ECX;
  int in_EDX;
  CharClassBuilder *in_RSI;
  bool bVar2;
  int i_3;
  int i_2;
  int next;
  bool cutnl;
  CharClassBuilder *in_stack_00000030;
  CharClassBuilder ccb1;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff70;
  ParseFlags in_stack_ffffffffffffff74;
  undefined8 in_stack_ffffffffffffff78;
  Rune lo;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff94;
  ParseFlags in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int iVar5;
  
  if (in_EDX == 1) {
    for (iVar5 = 0;
        iVar5 < (int)(in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
        iVar5 = iVar5 + 1) {
      CharClassBuilder::AddRangeFlags
                ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (Rune)((ulong)in_stack_ffffffffffffff78 >> 0x20),(Rune)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74);
    }
    for (iVar5 = 0;
        iVar5 < *(int *)&(in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar5 = iVar5 + 1) {
      CharClassBuilder::AddRangeFlags
                ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (Rune)((ulong)in_stack_ffffffffffffff78 >> 0x20),(Rune)in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff74);
    }
  }
  else {
    PVar1 = operator&(in_ECX,FoldCase);
    if (PVar1 == NoParseFlags) {
      uVar3 = 0;
      for (iVar5 = 0;
          iVar5 < (int)(in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          iVar5 = iVar5 + 1) {
        if (uVar3 < *(ushort *)(*(long *)&(in_RSI->ranges_)._M_t._M_impl + (long)iVar5 * 4)) {
          CharClassBuilder::AddRangeFlags
                    ((CharClassBuilder *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (Rune)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (Rune)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        }
        uVar3 = *(ushort *)(*(long *)&(in_RSI->ranges_)._M_t._M_impl + 2 + (long)iVar5 * 4) + 1;
      }
      iVar5 = 0;
      while( true ) {
        lo = (Rune)((ulong)in_stack_ffffffffffffff78 >> 0x20);
        if (*(int *)&(in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left <= iVar5
           ) break;
        if ((int)uVar3 <
            (int)(&((in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                   _M_color)[(long)iVar5 * 2]) {
          CharClassBuilder::AddRangeFlags
                    ((CharClassBuilder *)CONCAT44(iVar5,in_stack_ffffffffffffff80),lo,
                     (Rune)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        }
        uVar3 = *(int *)(&((in_RSI->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                          ->field_0x4 + (long)iVar5 * 8) + 1;
        iVar5 = iVar5 + 1;
      }
      if ((int)uVar3 < 0x110000) {
        CharClassBuilder::AddRangeFlags
                  ((CharClassBuilder *)CONCAT44(iVar5,in_stack_ffffffffffffff80),lo,
                   (Rune)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      }
    }
    else {
      CharClassBuilder::CharClassBuilder
                ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      AddUGroup(in_RSI,(UGroup *)CONCAT44(in_EDX,in_ECX),in_stack_ffffffffffffffe4,
                in_stack_ffffffffffffffe0);
      PVar1 = operator&(in_ECX,ClassNL);
      bVar2 = true;
      if (PVar1 != NoParseFlags) {
        PVar1 = operator&(in_ECX,NeverNL);
        bVar2 = PVar1 != NoParseFlags;
      }
      uVar4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff90);
      if (bVar2 != false) {
        CharClassBuilder::AddRange((CharClassBuilder *)g,sign,parse_flags);
      }
      CharClassBuilder::Negate(in_stack_00000030);
      CharClassBuilder::AddCharClass
                ((CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                 (CharClassBuilder *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      CharClassBuilder::~CharClassBuilder((CharClassBuilder *)0x24ed4f);
    }
  }
  return;
}

Assistant:

static void AddUGroup(CharClassBuilder *cc, const UGroup *g, int sign,
                      Regexp::ParseFlags parse_flags) {
  if (sign == +1) {
    for (int i = 0; i < g->nr16; i++) {
      cc->AddRangeFlags(g->r16[i].lo, g->r16[i].hi, parse_flags);
    }
    for (int i = 0; i < g->nr32; i++) {
      cc->AddRangeFlags(g->r32[i].lo, g->r32[i].hi, parse_flags);
    }
  } else {
    if (parse_flags & Regexp::FoldCase) {
      // Normally adding a case-folded group means
      // adding all the extra fold-equivalent runes too.
      // But if we're adding the negation of the group,
      // we have to exclude all the runes that are fold-equivalent
      // to what's already missing.  Too hard, so do in two steps.
      CharClassBuilder ccb1;
      AddUGroup(&ccb1, g, +1, parse_flags);
      // If the flags say to take out \n, put it in, so that negating will take it out.
      // Normally AddRangeFlags does this, but we're bypassing AddRangeFlags.
      bool cutnl = !(parse_flags & Regexp::ClassNL) ||
                   (parse_flags & Regexp::NeverNL);
      if (cutnl) {
        ccb1.AddRange('\n', '\n');
      }
      ccb1.Negate();
      cc->AddCharClass(&ccb1);
      return;
    }
    int next = 0;
    for (int i = 0; i < g->nr16; i++) {
      if (next < g->r16[i].lo)
        cc->AddRangeFlags(next, g->r16[i].lo - 1, parse_flags);
      next = g->r16[i].hi + 1;
    }
    for (int i = 0; i < g->nr32; i++) {
      if (next < g->r32[i].lo)
        cc->AddRangeFlags(next, g->r32[i].lo - 1, parse_flags);
      next = g->r32[i].hi + 1;
    }
    if (next <= Runemax)
      cc->AddRangeFlags(next, Runemax, parse_flags);
  }
}